

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalWatcomWMakeGenerator::cmGlobalWatcomWMakeGenerator
          (cmGlobalWatcomWMakeGenerator *this,cmake *cm)

{
  cmState *this_00;
  cmake *cm_local;
  cmGlobalWatcomWMakeGenerator *this_local;
  
  cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3
            (&this->super_cmGlobalUnixMakefileGenerator3,cm);
  (this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalWatcomWMakeGenerator_00a4ff08;
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.
              FindMakeProgramFile,"CMakeFindWMake.cmake");
  (this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.ToolSupportsColor = true;
  (this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.NeedSymbolicMark = true;
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmGlobalUnixMakefileGenerator3).EmptyRuleHackCommand,"@cd .");
  this_00 = cmake::GetState(cm);
  cmState::SetWatcomWMake(this_00,true);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmGlobalUnixMakefileGenerator3).IncludeDirective,"!include");
  (this->super_cmGlobalUnixMakefileGenerator3).DefineWindowsNULL = true;
  (this->super_cmGlobalUnixMakefileGenerator3).UnixCD = false;
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_cmGlobalUnixMakefileGenerator3).super_cmGlobalGenerator.MakeSilentFlag,
             "-h");
  return;
}

Assistant:

cmGlobalWatcomWMakeGenerator::cmGlobalWatcomWMakeGenerator(cmake* cm)
  : cmGlobalUnixMakefileGenerator3(cm)
{
  this->FindMakeProgramFile = "CMakeFindWMake.cmake";
#ifdef _WIN32
  this->ForceUnixPaths = false;
#endif
  this->ToolSupportsColor = true;
  this->NeedSymbolicMark = true;
  this->EmptyRuleHackCommand = "@cd .";
#ifdef _WIN32
  cm->GetState()->SetWindowsShell(true);
#endif
  cm->GetState()->SetWatcomWMake(true);
  this->IncludeDirective = "!include";
  this->DefineWindowsNULL = true;
  this->UnixCD = false;
  this->MakeSilentFlag = "-h";
}